

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_input.hpp
# Opt level: O3

variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *
get_input(variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
         int argc,char **argv)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  bool bVar4;
  ifstream file;
  long local_230 [4];
  int aiStack_210 [122];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage ",6);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10d0c8);
    }
    else {
      sVar2 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," path-to-input",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    *(undefined4 *)
     &(__return_storage_ptr__->
      super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
      super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
      super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
      super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
      super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
      super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_u = 0;
    (__return_storage_ptr__->
    super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
    super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
    super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
    super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
    super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
    super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index = '\0';
  }
  else {
    pcVar1 = argv[1];
    sVar2 = strlen(pcVar1);
    std::ifstream::ifstream(local_230,pcVar1,_S_in);
    bVar4 = *(int *)((long)aiStack_210 + *(long *)(local_230[0] + -0x18)) == 0;
    if (bVar4) {
      std::ifstream::ifstream(__return_storage_ptr__,(ifstream *)local_230);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Couldn\'t read ",0xe);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,pcVar1,sVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      *(undefined4 *)
       &(__return_storage_ptr__->
        super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
        super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_u = 1;
    }
    (__return_storage_ptr__->
    super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>).
    super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
    super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
    super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
    super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
    super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index = bVar4;
    std::ifstream::~ifstream(local_230);
  }
  return __return_storage_ptr__;
}

Assistant:

std::variant<int, std::ifstream> get_input(int argc, char* argv[]) {
  if (argc < 2) {
    std::cout << "usage " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cerr << "Couldn't read " << path << std::endl;
    return 1;
  }

  return file;
}